

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void fdct32_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  __m256i *palVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  longlong lVar18;
  __m256i alVar19;
  longlong lVar20;
  __m256i alVar21;
  longlong lVar22;
  __m256i alVar23;
  longlong lVar24;
  __m256i alVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  undefined7 in_register_00000011;
  int iVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  __m256i ww0;
  __m256i ww1;
  __m256i ww0_5;
  __m256i buf0 [32];
  longlong local_940;
  longlong lStack_938;
  longlong lStack_930;
  longlong local_920;
  longlong lStack_918;
  longlong lStack_910;
  longlong local_900;
  longlong lStack_8f8;
  longlong lStack_8f0;
  longlong local_8e0;
  longlong lStack_8d8;
  longlong lStack_8d0;
  __m256i local_8c0;
  __m256i local_8a0;
  __m256i local_880;
  __m256i local_860;
  __m256i local_840;
  __m256i local_820;
  __m256i local_800;
  __m256i local_7e0;
  __m256i local_7c0;
  __m256i local_7a0;
  __m256i local_780;
  __m256i local_760;
  __m256i local_740;
  __m256i local_720;
  __m256i local_700;
  __m256i local_6e0;
  __m256i local_6c0;
  __m256i local_6a0;
  __m256i local_680;
  __m256i local_660;
  __m256i local_640;
  __m256i local_620;
  __m256i local_600;
  __m256i local_5e0;
  __m256i local_5c0;
  __m256i local_5a0;
  __m256i local_580;
  __m256i local_560;
  undefined1 local_540 [32];
  __m256i local_520;
  __m256i local_500;
  __m256i local_4e0;
  __m256i local_4c0;
  __m256i local_4a0;
  __m256i local_480;
  __m256i local_460;
  __m256i local_440;
  __m256i local_420;
  __m256i local_400;
  __m256i local_3e0;
  __m256i local_3c0;
  __m256i local_3a0;
  __m256i local_380;
  __m256i local_360;
  __m256i local_340;
  __m256i local_320;
  __m256i local_300;
  __m256i local_2e0;
  __m256i local_2c0;
  __m256i local_2a0;
  __m256i local_280;
  __m256i local_260;
  undefined1 local_240 [32];
  __m256i local_220;
  __m256i local_200;
  __m256i local_1e0;
  __m256i local_1c0;
  undefined1 local_1a0 [32];
  __m256i local_180;
  __m256i local_160;
  __m256i local_140;
  __m256i local_120;
  __m256i local_100;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  auVar3 = vpaddd_avx2((undefined1  [32])input[instride * 0x1f],(undefined1  [32])*input);
  alVar7 = (__m256i)vpsubd_avx2((undefined1  [32])*input,(undefined1  [32])input[instride * 0x1f]);
  auVar4 = vpaddd_avx2((undefined1  [32])input[instride * 0x1e],(undefined1  [32])input[instride]);
  alVar8 = (__m256i)vpsubd_avx2((undefined1  [32])input[instride],
                                (undefined1  [32])input[instride * 0x1e]);
  auVar31 = vpaddd_avx2((undefined1  [32])input[instride * 0x1d],
                        (undefined1  [32])input[instride * 2]);
  alVar9 = (__m256i)vpsubd_avx2((undefined1  [32])input[instride * 2],
                                (undefined1  [32])input[instride * 0x1d]);
  auVar32 = vpaddd_avx2((undefined1  [32])input[instride * 0x1c],
                        (undefined1  [32])input[instride * 3]);
  alVar10 = (__m256i)vpsubd_avx2((undefined1  [32])input[instride * 3],
                                 (undefined1  [32])input[instride * 0x1c]);
  auVar5 = vpaddd_avx2((undefined1  [32])input[instride * 0x1b],
                       (undefined1  [32])input[instride * 4]);
  auVar40 = vpsubd_avx2((undefined1  [32])input[instride * 4],
                        (undefined1  [32])input[instride * 0x1b]);
  auVar34 = vpaddd_avx2((undefined1  [32])input[instride * 0x1a],
                        (undefined1  [32])input[instride * 5]);
  auVar48 = vpsubd_avx2((undefined1  [32])input[instride * 5],
                        (undefined1  [32])input[instride * 0x1a]);
  auVar35 = vpaddd_avx2((undefined1  [32])input[instride * 0x19],
                        (undefined1  [32])input[instride * 6]);
  auVar50 = vpsubd_avx2((undefined1  [32])input[instride * 6],
                        (undefined1  [32])input[instride * 0x19]);
  auVar36 = vpaddd_avx2((undefined1  [32])input[instride * 0x18],
                        (undefined1  [32])input[instride * 7]);
  auVar47 = vpsubd_avx2((undefined1  [32])input[instride * 7],
                        (undefined1  [32])input[instride * 0x18]);
  auVar37 = vpaddd_avx2((undefined1  [32])input[instride * 0x17],
                        (undefined1  [32])input[instride * 8]);
  auVar44 = vpsubd_avx2((undefined1  [32])input[instride * 8],
                        (undefined1  [32])input[instride * 0x17]);
  auVar38 = vpaddd_avx2((undefined1  [32])input[instride * 0x16],
                        (undefined1  [32])input[instride * 9]);
  auVar43 = vpsubd_avx2((undefined1  [32])input[instride * 9],
                        (undefined1  [32])input[instride * 0x16]);
  auVar33 = vpaddd_avx2((undefined1  [32])input[instride * 0x15],
                        (undefined1  [32])input[instride * 10]);
  auVar41 = vpsubd_avx2((undefined1  [32])input[instride * 10],
                        (undefined1  [32])input[instride * 0x15]);
  local_380 = (__m256i)vpaddd_avx2((undefined1  [32])input[instride * 0x14],
                                   (undefined1  [32])input[instride * 0xb]);
  auVar42 = vpsubd_avx2((undefined1  [32])input[instride * 0xb],
                        (undefined1  [32])input[instride * 0x14]);
  local_360 = (__m256i)vpaddd_avx2((undefined1  [32])input[instride * 0x13],
                                   (undefined1  [32])input[instride * 0xc]);
  local_6e0 = (__m256i)vpsubd_avx2((undefined1  [32])input[instride * 0xc],
                                   (undefined1  [32])input[instride * 0x13]);
  local_340 = (__m256i)vpaddd_avx2((undefined1  [32])input[instride * 0x12],
                                   (undefined1  [32])input[instride * 0xd]);
  local_700 = (__m256i)vpsubd_avx2((undefined1  [32])input[instride * 0xd],
                                   (undefined1  [32])input[instride * 0x12]);
  local_320 = (__m256i)vpaddd_avx2((undefined1  [32])input[instride * 0x11],
                                   (undefined1  [32])input[instride * 0xe]);
  local_720 = (__m256i)vpsubd_avx2((undefined1  [32])input[instride * 0xe],
                                   (undefined1  [32])input[instride * 0x11]);
  local_300 = (__m256i)vpaddd_avx2((undefined1  [32])input[instride << 4],
                                   (undefined1  [32])input[instride * 0xf]);
  local_740 = (__m256i)vpsubd_avx2((undefined1  [32])input[instride * 0xf],
                                   (undefined1  [32])input[instride << 4]);
  auVar39 = vpaddd_avx2((undefined1  [32])local_300,auVar3);
  local_760 = (__m256i)vpsubd_avx2(auVar3,(undefined1  [32])local_300);
  auVar3 = vpaddd_avx2((undefined1  [32])local_320,auVar4);
  local_780 = (__m256i)vpsubd_avx2(auVar4,(undefined1  [32])local_320);
  auVar4 = vpaddd_avx2((undefined1  [32])local_340,auVar31);
  local_7a0 = (__m256i)vpsubd_avx2(auVar31,(undefined1  [32])local_340);
  auVar31 = vpaddd_avx2((undefined1  [32])local_360,auVar32);
  local_7c0 = (__m256i)vpsubd_avx2(auVar32,(undefined1  [32])local_360);
  local_8c0 = (__m256i)vpaddd_avx2((undefined1  [32])local_380,auVar5);
  local_7e0 = (__m256i)vpsubd_avx2(auVar5,(undefined1  [32])local_380);
  local_8a0 = (__m256i)vpaddd_avx2(auVar33,auVar34);
  local_800 = (__m256i)vpsubd_avx2(auVar34,auVar33);
  local_880 = (__m256i)vpaddd_avx2(auVar38,auVar35);
  local_820 = (__m256i)vpsubd_avx2(auVar35,auVar38);
  local_860 = (__m256i)vpaddd_avx2(auVar37,auVar36);
  local_840 = (__m256i)vpsubd_avx2(auVar36,auVar37);
  iVar30 = (int)CONCAT71(in_register_00000011,cos_bit);
  lVar29 = (long)iVar30 * 0x100;
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar29 + 0x1e0);
  iVar26 = -iVar28;
  auVar60._4_4_ = iVar26;
  auVar60._0_4_ = iVar26;
  auVar60._8_4_ = iVar26;
  auVar60._12_4_ = iVar26;
  auVar60._16_4_ = iVar26;
  auVar60._20_4_ = iVar26;
  auVar60._24_4_ = iVar26;
  auVar60._28_4_ = iVar26;
  auVar49._4_4_ = iVar28;
  auVar49._0_4_ = iVar28;
  auVar49._8_4_ = iVar28;
  auVar49._12_4_ = iVar28;
  auVar49._16_4_ = iVar28;
  auVar49._20_4_ = iVar28;
  auVar49._24_4_ = iVar28;
  auVar49._28_4_ = iVar28;
  auVar32 = vpmulld_avx2(auVar60,auVar42);
  auVar5 = vpmulld_avx2(auVar49,auVar40);
  local_6c0 = (__m256i)vpaddd_avx2(auVar32,auVar5);
  iVar30 = -iVar30;
  local_2e0 = local_740;
  local_2c0 = local_720;
  local_2a0 = local_700;
  local_280 = local_6e0;
  local_260 = (__m256i)auVar42;
  local_240 = auVar41;
  local_220 = (__m256i)auVar43;
  local_200 = (__m256i)auVar44;
  local_1e0 = (__m256i)auVar47;
  local_1c0 = (__m256i)auVar50;
  local_1a0 = auVar48;
  local_180 = (__m256i)auVar40;
  local_160 = alVar10;
  local_140 = alVar9;
  local_120 = alVar8;
  local_100 = alVar7;
  round_shift_32_8xn_avx2(&local_6c0,1,iVar30,1);
  auVar32 = vpmulld_avx2(auVar42,auVar49);
  auVar5 = vpmulld_avx2(auVar40,auVar60);
  local_5e0 = (__m256i)vpsubd_avx2(auVar32,auVar5);
  round_shift_32_8xn_avx2(&local_5e0,1,iVar30,1);
  auVar32 = vpmulld_avx2(auVar41,auVar60);
  auVar5 = vpmulld_avx2(auVar48,auVar49);
  local_6a0 = (__m256i)vpaddd_avx2(auVar32,auVar5);
  round_shift_32_8xn_avx2(&local_6a0,1,iVar30,1);
  auVar32 = vpmulld_avx2(auVar41,auVar49);
  auVar5 = vpmulld_avx2(auVar60,auVar48);
  local_600 = (__m256i)vpsubd_avx2(auVar32,auVar5);
  round_shift_32_8xn_avx2(&local_600,1,iVar30,1);
  auVar32 = vpmulld_avx2(auVar43,auVar60);
  auVar5 = vpmulld_avx2(auVar50,auVar49);
  local_680 = (__m256i)vpaddd_avx2(auVar32,auVar5);
  round_shift_32_8xn_avx2(&local_680,1,iVar30,1);
  auVar32 = vpmulld_avx2(auVar43,auVar49);
  auVar5 = vpmulld_avx2(auVar60,auVar50);
  local_620 = (__m256i)vpsubd_avx2(auVar32,auVar5);
  round_shift_32_8xn_avx2(&local_620,1,iVar30,1);
  auVar32 = vpmulld_avx2(auVar60,auVar44);
  auVar5 = vpmulld_avx2(auVar47,auVar49);
  local_660 = (__m256i)vpaddd_avx2(auVar32,auVar5);
  round_shift_32_8xn_avx2(&local_660,1,iVar30,1);
  auVar32 = vpmulld_avx2(auVar44,auVar49);
  auVar5 = vpmulld_avx2(auVar60,auVar47);
  local_640 = (__m256i)vpsubd_avx2(auVar32,auVar5);
  round_shift_32_8xn_avx2(&local_640,1,iVar30,1);
  alVar11 = local_7a0;
  alVar6 = local_800;
  local_4e0 = (__m256i)vpaddd_avx2((undefined1  [32])local_860,auVar39);
  local_400 = (__m256i)vpsubd_avx2(auVar39,(undefined1  [32])local_860);
  local_4c0 = (__m256i)vpaddd_avx2((undefined1  [32])local_880,auVar3);
  local_420 = (__m256i)vpsubd_avx2(auVar3,(undefined1  [32])local_880);
  local_4a0 = (__m256i)vpaddd_avx2((undefined1  [32])local_8a0,auVar4);
  local_440 = (__m256i)vpsubd_avx2(auVar4,(undefined1  [32])local_8a0);
  local_480 = (__m256i)vpaddd_avx2((undefined1  [32])local_8c0,auVar31);
  local_460 = (__m256i)vpsubd_avx2(auVar31,(undefined1  [32])local_8c0);
  local_3e0[0] = local_840[0];
  local_3e0[1] = local_840[1];
  local_3e0[2] = local_840[2];
  local_3e0[3] = local_840[3];
  local_3c0[0] = local_820[0];
  local_3c0[1] = local_820[1];
  local_3c0[2] = local_820[2];
  local_3c0[3] = local_820[3];
  auVar3 = vpmulld_avx2((undefined1  [32])local_800,auVar60);
  auVar4 = vpmulld_avx2((undefined1  [32])local_7a0,auVar49);
  local_3a0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  local_5c0 = alVar10;
  local_5a0 = alVar9;
  local_580 = alVar8;
  local_560 = alVar7;
  round_shift_32_8xn_avx2(&local_3a0,1,iVar30,1);
  auVar3 = vpmulld_avx2((undefined1  [32])alVar6,auVar49);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar11,auVar60);
  local_340 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_340,1,iVar30,1);
  alVar11 = local_7c0;
  alVar6 = local_7e0;
  auVar3 = vpmulld_avx2((undefined1  [32])local_7e0,auVar60);
  auVar4 = vpmulld_avx2((undefined1  [32])local_7c0,auVar49);
  local_380 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_380,1,iVar30,1);
  auVar3 = vpmulld_avx2((undefined1  [32])alVar6,auVar49);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar11,auVar60);
  local_360 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_360,1,iVar30,1);
  alVar17 = local_440;
  alVar16 = local_760;
  alVar15 = local_780;
  alVar6 = (__m256i)vpaddd_avx2((undefined1  [32])local_660,(undefined1  [32])local_740);
  alVar11 = (__m256i)vpsubd_avx2((undefined1  [32])local_740,(undefined1  [32])local_660);
  local_500 = (__m256i)vpaddd_avx2((undefined1  [32])local_680,(undefined1  [32])local_720);
  alVar12 = (__m256i)vpsubd_avx2((undefined1  [32])local_720,(undefined1  [32])local_680);
  auVar3 = vpaddd_avx2((undefined1  [32])local_6a0,(undefined1  [32])local_700);
  auVar37 = vpsubd_avx2((undefined1  [32])local_700,(undefined1  [32])local_6a0);
  auVar4 = vpaddd_avx2((undefined1  [32])local_6c0,(undefined1  [32])local_6e0);
  auVar38 = vpsubd_avx2((undefined1  [32])local_6e0,(undefined1  [32])local_6c0);
  alVar13 = (__m256i)vpsubd_avx2((undefined1  [32])alVar7,(undefined1  [32])local_640);
  alVar7 = (__m256i)vpaddd_avx2((undefined1  [32])local_640,(undefined1  [32])alVar7);
  alVar14 = (__m256i)vpsubd_avx2((undefined1  [32])alVar8,(undefined1  [32])local_620);
  alVar8 = (__m256i)vpaddd_avx2((undefined1  [32])local_620,(undefined1  [32])alVar8);
  auVar33 = vpsubd_avx2((undefined1  [32])alVar9,(undefined1  [32])local_600);
  auVar31 = vpaddd_avx2((undefined1  [32])local_600,(undefined1  [32])alVar9);
  auVar39 = vpsubd_avx2((undefined1  [32])alVar10,(undefined1  [32])local_5e0);
  auVar32 = vpaddd_avx2((undefined1  [32])local_5e0,(undefined1  [32])alVar10);
  local_320[0] = local_780[0];
  local_320[1] = local_780[1];
  local_320[2] = local_780[2];
  local_320[3] = local_780[3];
  local_300[0] = local_760[0];
  local_300[1] = local_760[1];
  local_300[2] = local_760[2];
  local_300[3] = local_760[3];
  auVar5 = vpaddd_avx2((undefined1  [32])local_480,(undefined1  [32])local_4e0);
  auVar40 = vpsubd_avx2((undefined1  [32])local_4e0,(undefined1  [32])local_480);
  auVar34 = vpaddd_avx2((undefined1  [32])local_4a0,(undefined1  [32])local_4c0);
  auVar48 = vpsubd_avx2((undefined1  [32])local_4c0,(undefined1  [32])local_4a0);
  local_8c0[0] = local_460[0];
  local_8c0[1] = local_460[1];
  local_8c0[2] = local_460[2];
  local_8c0[3] = local_460[3];
  local_520[0] = local_420[0];
  local_520[1] = local_420[1];
  local_520[2] = local_420[2];
  local_520[3] = local_420[3];
  auVar35 = vpmulld_avx2((undefined1  [32])local_440,auVar60);
  auVar36 = vpmulld_avx2((undefined1  [32])local_420,auVar49);
  local_8a0 = (__m256i)vpaddd_avx2(auVar36,auVar35);
  local_2e0 = alVar6;
  local_2c0 = local_500;
  local_2a0 = (__m256i)auVar3;
  local_280 = (__m256i)auVar4;
  local_260 = (__m256i)auVar38;
  local_240 = auVar37;
  local_220 = alVar12;
  local_200 = alVar11;
  local_1e0 = alVar13;
  local_1c0 = alVar14;
  local_1a0 = auVar33;
  local_180 = (__m256i)auVar39;
  local_160 = (__m256i)auVar32;
  local_140 = (__m256i)auVar31;
  local_120 = alVar8;
  local_100 = alVar7;
  round_shift_32_8xn_avx2(&local_8a0,1,iVar30,1);
  auVar35 = vpmulld_avx2((undefined1  [32])alVar17,auVar49);
  auVar36 = vpmulld_avx2((undefined1  [32])local_520,auVar60);
  local_880 = (__m256i)vpsubd_avx2(auVar35,auVar36);
  round_shift_32_8xn_avx2(&local_880,1,iVar30,1);
  local_860[0] = local_400[0];
  local_860[1] = local_400[1];
  local_860[2] = local_400[2];
  local_860[3] = local_400[3];
  local_840 = (__m256i)vpaddd_avx2((undefined1  [32])local_380,(undefined1  [32])local_3e0);
  local_7e0 = (__m256i)vpsubd_avx2((undefined1  [32])local_3e0,(undefined1  [32])local_380);
  local_820 = (__m256i)vpaddd_avx2((undefined1  [32])local_3a0,(undefined1  [32])local_3c0);
  local_800 = (__m256i)vpsubd_avx2((undefined1  [32])local_3c0,(undefined1  [32])local_3a0);
  local_7c0 = (__m256i)vpsubd_avx2((undefined1  [32])alVar16,(undefined1  [32])local_360);
  local_760 = (__m256i)vpaddd_avx2((undefined1  [32])local_360,(undefined1  [32])alVar16);
  local_7a0 = (__m256i)vpsubd_avx2((undefined1  [32])alVar15,(undefined1  [32])local_340);
  local_780 = (__m256i)vpaddd_avx2((undefined1  [32])local_340,(undefined1  [32])alVar15);
  local_720[0] = local_500[0];
  local_720[1] = local_500[1];
  local_720[2] = local_500[2];
  local_720[3] = local_500[3];
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar29 + 0x180);
  iVar26 = *(int *)((long)vert_filter_length_chroma + lVar29 + 0x1a0);
  iVar27 = -iVar26;
  auVar50._4_4_ = iVar27;
  auVar50._0_4_ = iVar27;
  auVar50._8_4_ = iVar27;
  auVar50._12_4_ = iVar27;
  auVar50._16_4_ = iVar27;
  auVar50._20_4_ = iVar27;
  auVar50._24_4_ = iVar27;
  auVar50._28_4_ = iVar27;
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar29 + 0x220);
  auVar61._4_4_ = iVar27;
  auVar61._0_4_ = iVar27;
  auVar61._8_4_ = iVar27;
  auVar61._12_4_ = iVar27;
  auVar61._16_4_ = iVar27;
  auVar61._20_4_ = iVar27;
  auVar61._24_4_ = iVar27;
  auVar61._28_4_ = iVar27;
  auVar35 = vpmulld_avx2(auVar50,auVar3);
  auVar36 = vpmulld_avx2(auVar61,auVar31);
  local_700 = (__m256i)vpaddd_avx2(auVar36,auVar35);
  local_740 = alVar6;
  round_shift_32_8xn_avx2(&local_700,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar3,auVar61);
  auVar31 = vpmulld_avx2(auVar31,auVar50);
  local_5a0 = (__m256i)vpsubd_avx2(auVar3,auVar31);
  round_shift_32_8xn_avx2(&local_5a0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar4,auVar50);
  auVar31 = vpmulld_avx2(auVar32,auVar61);
  local_6e0 = (__m256i)vpaddd_avx2(auVar31,auVar3);
  round_shift_32_8xn_avx2(&local_6e0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar4,auVar61);
  auVar4 = vpmulld_avx2(auVar32,auVar50);
  local_5c0 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_5c0,1,iVar30,1);
  iVar27 = -iVar27;
  auVar31._4_4_ = iVar27;
  auVar31._0_4_ = iVar27;
  auVar31._8_4_ = iVar27;
  auVar31._12_4_ = iVar27;
  auVar31._16_4_ = iVar27;
  auVar31._20_4_ = iVar27;
  auVar31._24_4_ = iVar27;
  auVar31._28_4_ = iVar27;
  auVar3 = vpmulld_avx2(auVar31,auVar38);
  auVar4 = vpmulld_avx2(auVar39,auVar50);
  local_6c0 = (__m256i)vpaddd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_6c0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar38,auVar50);
  auVar4 = vpmulld_avx2(auVar39,auVar31);
  local_5e0 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_5e0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar31,auVar37);
  auVar4 = vpmulld_avx2(auVar33,auVar50);
  local_6a0 = (__m256i)vpaddd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_6a0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar37,auVar50);
  auVar4 = vpmulld_avx2(auVar31,auVar33);
  local_600 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_600,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar49,auVar5);
  auVar4 = vpmulld_avx2(auVar49,auVar34);
  local_4e0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  local_680 = alVar12;
  local_660 = alVar11;
  local_640 = alVar13;
  local_620 = alVar14;
  local_580 = alVar8;
  local_560 = alVar7;
  round_shift_32_8xn_avx2(&local_4e0,1,iVar30,1);
  local_4c0 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_4c0,1,iVar30,1);
  auVar32._4_4_ = iVar26;
  auVar32._0_4_ = iVar26;
  auVar32._8_4_ = iVar26;
  auVar32._12_4_ = iVar26;
  auVar32._16_4_ = iVar26;
  auVar32._20_4_ = iVar26;
  auVar32._24_4_ = iVar26;
  auVar32._28_4_ = iVar26;
  auVar3 = vpmulld_avx2(auVar40,auVar32);
  auVar4 = vpmulld_avx2(auVar48,auVar61);
  local_4a0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_4a0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar40,auVar61);
  auVar4 = vpmulld_avx2(auVar48,auVar32);
  local_480 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_480,1,iVar30,1);
  alVar9 = local_780;
  alVar6 = local_820;
  local_460 = (__m256i)vpaddd_avx2((undefined1  [32])local_8a0,(undefined1  [32])local_8c0);
  local_440 = (__m256i)vpsubd_avx2((undefined1  [32])local_8c0,(undefined1  [32])local_8a0);
  local_420 = (__m256i)vpsubd_avx2((undefined1  [32])local_860,(undefined1  [32])local_880);
  local_400 = (__m256i)vpaddd_avx2((undefined1  [32])local_880,(undefined1  [32])local_860);
  local_3e0[0] = local_840[0];
  local_3e0[1] = local_840[1];
  local_3e0[2] = local_840[2];
  local_3e0[3] = local_840[3];
  auVar3 = vpmulld_avx2((undefined1  [32])local_820,auVar50);
  auVar4 = vpmulld_avx2((undefined1  [32])local_780,auVar61);
  local_3c0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_3c0,1,iVar30,1);
  auVar3 = vpmulld_avx2((undefined1  [32])alVar6,auVar61);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar9,auVar50);
  local_320 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_320,1,iVar30,1);
  alVar9 = local_7a0;
  alVar6 = local_800;
  auVar3 = vpmulld_avx2((undefined1  [32])local_800,auVar31);
  auVar4 = vpmulld_avx2((undefined1  [32])local_7a0,auVar50);
  local_3a0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_3a0,1,iVar30,1);
  auVar3 = vpmulld_avx2((undefined1  [32])alVar6,auVar50);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar9,auVar31);
  local_340 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_340,1,iVar30,1);
  alVar25 = local_460;
  alVar23 = local_480;
  alVar21 = local_4a0;
  alVar19 = local_4c0;
  alVar17 = local_4e0;
  alVar6 = (__m256i)vpaddd_avx2((undefined1  [32])local_6e0,(undefined1  [32])local_740);
  alVar15 = (__m256i)vpsubd_avx2((undefined1  [32])local_740,(undefined1  [32])local_6e0);
  auVar3 = vpaddd_avx2((undefined1  [32])local_700,(undefined1  [32])local_720);
  auVar35 = vpsubd_avx2((undefined1  [32])local_720,(undefined1  [32])local_700);
  alVar16 = (__m256i)vpsubd_avx2((undefined1  [32])alVar11,(undefined1  [32])local_6c0);
  alVar9 = (__m256i)vpaddd_avx2((undefined1  [32])local_6c0,(undefined1  [32])alVar11);
  auVar36 = vpsubd_avx2((undefined1  [32])alVar12,(undefined1  [32])local_6a0);
  auVar4 = vpaddd_avx2((undefined1  [32])local_6a0,(undefined1  [32])alVar12);
  alVar10 = (__m256i)vpaddd_avx2((undefined1  [32])local_5e0,(undefined1  [32])alVar13);
  alVar11 = (__m256i)vpsubd_avx2((undefined1  [32])alVar13,(undefined1  [32])local_5e0);
  auVar31 = vpaddd_avx2((undefined1  [32])local_600,(undefined1  [32])alVar14);
  auVar37 = vpsubd_avx2((undefined1  [32])alVar14,(undefined1  [32])local_600);
  alVar12 = (__m256i)vpsubd_avx2((undefined1  [32])alVar7,(undefined1  [32])local_5c0);
  alVar7 = (__m256i)vpaddd_avx2((undefined1  [32])local_5c0,(undefined1  [32])alVar7);
  auVar38 = vpsubd_avx2((undefined1  [32])alVar8,(undefined1  [32])local_5a0);
  auVar32 = vpaddd_avx2((undefined1  [32])local_5a0,(undefined1  [32])alVar8);
  local_80 = local_7e0[0];
  lStack_78 = local_7e0[1];
  lStack_70 = local_7e0[2];
  lStack_68 = local_7e0[3];
  local_380[0] = local_7e0[0];
  local_380[1] = local_7e0[1];
  local_380[2] = local_7e0[2];
  local_380[3] = local_7e0[3];
  local_520[0] = local_7c0[0];
  local_520[1] = local_7c0[1];
  local_520[2] = local_7c0[2];
  local_520[3] = local_7c0[3];
  local_360[0] = local_7c0[0];
  local_360[1] = local_7c0[1];
  local_360[2] = local_7c0[2];
  local_360[3] = local_7c0[3];
  local_500[0] = local_760[0];
  local_500[1] = local_760[1];
  local_500[2] = local_760[2];
  local_500[3] = local_760[3];
  local_300[0] = local_760[0];
  local_300[1] = local_760[1];
  local_300[2] = local_760[2];
  local_300[3] = local_760[3];
  auVar62._4_4_ = iVar28;
  auVar62._0_4_ = iVar28;
  auVar62._8_4_ = iVar28;
  auVar62._12_4_ = iVar28;
  auVar62._16_4_ = iVar28;
  auVar62._20_4_ = iVar28;
  auVar62._24_4_ = iVar28;
  auVar62._28_4_ = iVar28;
  iVar26 = *(int *)((long)vert_filter_length_chroma + lVar29 + 0x240);
  auVar51._4_4_ = iVar26;
  auVar51._0_4_ = iVar26;
  auVar51._8_4_ = iVar26;
  auVar51._12_4_ = iVar26;
  auVar51._16_4_ = iVar26;
  auVar51._20_4_ = iVar26;
  auVar51._24_4_ = iVar26;
  auVar51._28_4_ = iVar26;
  local_540._0_8_ = local_400[0];
  local_540._8_8_ = local_400[1];
  local_540._16_8_ = local_400[2];
  local_540._24_8_ = local_400[3];
  auVar5 = vpmulld_avx2((undefined1  [32])local_400,auVar62);
  auVar34 = vpmulld_avx2((undefined1  [32])local_460,auVar51);
  local_8c0 = (__m256i)vpaddd_avx2(auVar34,auVar5);
  local_2e0 = alVar6;
  local_2c0 = (__m256i)auVar3;
  local_2a0 = (__m256i)auVar35;
  local_280 = alVar15;
  local_260 = alVar16;
  local_240 = auVar36;
  local_220 = (__m256i)auVar4;
  local_200 = alVar9;
  local_1e0 = alVar10;
  local_1c0 = (__m256i)auVar31;
  local_1a0 = auVar37;
  local_180 = alVar11;
  local_160 = alVar12;
  local_140 = (__m256i)auVar38;
  local_120 = (__m256i)auVar32;
  local_100 = alVar7;
  round_shift_32_8xn_avx2(&local_8c0,1,iVar30,1);
  auVar5 = vpmulld_avx2(local_540,auVar51);
  auVar34 = vpmulld_avx2((undefined1  [32])alVar25,auVar62);
  local_860 = (__m256i)vpsubd_avx2(auVar5,auVar34);
  round_shift_32_8xn_avx2(&local_860,1,iVar30,1);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x200);
  local_540._0_4_ = uVar2;
  local_a0._4_4_ = uVar2;
  local_a0._0_4_ = uVar2;
  local_a0._8_4_ = uVar2;
  local_a0._12_4_ = uVar2;
  local_a0._16_4_ = uVar2;
  local_a0._20_4_ = uVar2;
  local_a0._24_4_ = uVar2;
  local_a0._28_4_ = uVar2;
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar29 + 0x1c0);
  auVar52._4_4_ = iVar27;
  auVar52._0_4_ = iVar27;
  auVar52._8_4_ = iVar27;
  auVar52._12_4_ = iVar27;
  auVar52._16_4_ = iVar27;
  auVar52._20_4_ = iVar27;
  auVar52._24_4_ = iVar27;
  auVar52._28_4_ = iVar27;
  local_c0._0_8_ = local_440[0];
  local_c0._8_8_ = local_440[1];
  local_c0._16_8_ = local_440[2];
  local_c0._24_8_ = local_440[3];
  local_e0._0_8_ = local_420[0];
  local_e0._8_8_ = local_420[1];
  local_e0._16_8_ = local_420[2];
  local_e0._24_8_ = local_420[3];
  auVar5 = vpmulld_avx2((undefined1  [32])local_420,local_a0);
  auVar34 = vpmulld_avx2((undefined1  [32])local_440,auVar52);
  local_8a0 = (__m256i)vpaddd_avx2(auVar34,auVar5);
  round_shift_32_8xn_avx2(&local_8a0,1,iVar30,1);
  auVar5 = vpmulld_avx2(local_e0,auVar52);
  auVar34 = vpmulld_avx2(local_c0,local_a0);
  local_880 = (__m256i)vpsubd_avx2(auVar5,auVar34);
  round_shift_32_8xn_avx2(&local_880,1,iVar30,1);
  local_840 = (__m256i)vpaddd_avx2((undefined1  [32])local_3c0,(undefined1  [32])local_3e0);
  local_820 = (__m256i)vpsubd_avx2((undefined1  [32])local_3e0,(undefined1  [32])local_3c0);
  auVar5._8_8_ = lStack_78;
  auVar5._0_8_ = local_80;
  auVar5._16_8_ = lStack_70;
  auVar5._24_8_ = lStack_68;
  local_800 = (__m256i)vpsubd_avx2(auVar5,(undefined1  [32])local_3a0);
  local_7e0 = (__m256i)vpaddd_avx2((undefined1  [32])local_3a0,auVar5);
  local_7c0 = (__m256i)vpaddd_avx2((undefined1  [32])local_340,(undefined1  [32])local_520);
  local_7a0 = (__m256i)vpsubd_avx2((undefined1  [32])local_520,(undefined1  [32])local_340);
  local_780 = (__m256i)vpsubd_avx2((undefined1  [32])local_500,(undefined1  [32])local_320);
  local_760 = (__m256i)vpaddd_avx2((undefined1  [32])local_320,(undefined1  [32])local_500);
  iVar28 = -iVar28;
  auVar33._4_4_ = iVar28;
  auVar33._0_4_ = iVar28;
  auVar33._8_4_ = iVar28;
  auVar33._12_4_ = iVar28;
  auVar33._16_4_ = iVar28;
  auVar33._20_4_ = iVar28;
  auVar33._24_4_ = iVar28;
  auVar33._28_4_ = iVar28;
  auVar5 = vpmulld_avx2(auVar33,auVar3);
  auVar34 = vpmulld_avx2(auVar51,auVar32);
  local_720 = (__m256i)vpaddd_avx2(auVar34,auVar5);
  local_740 = alVar6;
  round_shift_32_8xn_avx2(&local_720,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar51,auVar3);
  auVar32 = vpmulld_avx2(auVar33,auVar32);
  local_580 = (__m256i)vpsubd_avx2(auVar3,auVar32);
  round_shift_32_8xn_avx2(&local_580,1,iVar30,1);
  iVar26 = -iVar26;
  auVar34._4_4_ = iVar26;
  auVar34._0_4_ = iVar26;
  auVar34._8_4_ = iVar26;
  auVar34._12_4_ = iVar26;
  auVar34._16_4_ = iVar26;
  auVar34._20_4_ = iVar26;
  auVar34._24_4_ = iVar26;
  auVar34._28_4_ = iVar26;
  auVar3 = vpmulld_avx2(auVar34,auVar35);
  auVar32 = vpmulld_avx2(auVar33,auVar38);
  local_700 = (__m256i)vpaddd_avx2(auVar3,auVar32);
  round_shift_32_8xn_avx2(&local_700,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar33,auVar35);
  auVar32 = vpmulld_avx2(auVar34,auVar38);
  local_5a0 = (__m256i)vpsubd_avx2(auVar3,auVar32);
  round_shift_32_8xn_avx2(&local_5a0,1,iVar30,1);
  iVar28 = -local_540._0_4_;
  auVar35._4_4_ = iVar28;
  auVar35._0_4_ = iVar28;
  auVar35._8_4_ = iVar28;
  auVar35._12_4_ = iVar28;
  auVar35._16_4_ = iVar28;
  auVar35._20_4_ = iVar28;
  auVar35._24_4_ = iVar28;
  auVar35._28_4_ = iVar28;
  auVar3 = vpmulld_avx2(auVar35,auVar36);
  auVar32 = vpmulld_avx2(auVar52,auVar37);
  local_6a0 = (__m256i)vpaddd_avx2(auVar32,auVar3);
  local_6e0 = alVar15;
  local_6c0 = alVar16;
  round_shift_32_8xn_avx2(&local_6a0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar52,auVar36);
  auVar32 = vpmulld_avx2(auVar35,auVar37);
  local_600 = (__m256i)vpsubd_avx2(auVar3,auVar32);
  round_shift_32_8xn_avx2(&local_600,1,iVar30,1);
  iVar27 = -iVar27;
  auVar36._4_4_ = iVar27;
  auVar36._0_4_ = iVar27;
  auVar36._8_4_ = iVar27;
  auVar36._12_4_ = iVar27;
  auVar36._16_4_ = iVar27;
  auVar36._20_4_ = iVar27;
  auVar36._24_4_ = iVar27;
  auVar36._28_4_ = iVar27;
  auVar3 = vpmulld_avx2(auVar36,auVar4);
  auVar32 = vpmulld_avx2(auVar35,auVar31);
  local_680 = (__m256i)vpaddd_avx2(auVar3,auVar32);
  round_shift_32_8xn_avx2(&local_680,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar35,auVar4);
  auVar4 = vpmulld_avx2(auVar36,auVar31);
  local_620 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_620,1,iVar30,1);
  alVar8 = local_760;
  alVar6 = local_840;
  local_460[0] = local_8c0[0];
  local_460[1] = local_8c0[1];
  local_460[2] = local_8c0[2];
  local_460[3] = local_8c0[3];
  local_440[0] = local_8a0[0];
  local_440[1] = local_8a0[1];
  local_440[2] = local_8a0[2];
  local_440[3] = local_8a0[3];
  local_420[0] = local_880[0];
  local_420[1] = local_880[1];
  local_420[2] = local_880[2];
  local_420[3] = local_880[3];
  local_400[0] = local_860[0];
  local_400[1] = local_860[1];
  local_400[2] = local_860[2];
  local_400[3] = local_860[3];
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x170);
  auVar37._4_4_ = uVar2;
  auVar37._0_4_ = uVar2;
  auVar37._8_4_ = uVar2;
  auVar37._12_4_ = uVar2;
  auVar37._16_4_ = uVar2;
  auVar37._20_4_ = uVar2;
  auVar37._24_4_ = uVar2;
  auVar37._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x250);
  auVar67._4_4_ = uVar2;
  auVar67._0_4_ = uVar2;
  auVar67._8_4_ = uVar2;
  auVar67._12_4_ = uVar2;
  auVar67._16_4_ = uVar2;
  auVar67._20_4_ = uVar2;
  auVar67._24_4_ = uVar2;
  auVar67._28_4_ = uVar2;
  auVar3 = vpmulld_avx2((undefined1  [32])local_760,auVar37);
  auVar4 = vpmulld_avx2((undefined1  [32])local_840,auVar67);
  local_3e0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  local_660 = alVar9;
  local_640 = alVar10;
  local_5e0 = alVar11;
  local_5c0 = alVar12;
  local_560 = alVar7;
  local_4e0 = alVar17;
  local_4c0 = alVar19;
  local_4a0 = alVar21;
  local_480 = alVar23;
  round_shift_32_8xn_avx2(&local_3e0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar67,(undefined1  [32])alVar8);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar6,auVar37);
  local_300 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_300,1,iVar30,1);
  alVar8 = local_780;
  alVar6 = local_820;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1f0);
  auVar38._4_4_ = uVar2;
  auVar38._0_4_ = uVar2;
  auVar38._8_4_ = uVar2;
  auVar38._12_4_ = uVar2;
  auVar38._16_4_ = uVar2;
  auVar38._20_4_ = uVar2;
  auVar38._24_4_ = uVar2;
  auVar38._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1d0);
  auVar63._4_4_ = uVar2;
  auVar63._0_4_ = uVar2;
  auVar63._8_4_ = uVar2;
  auVar63._12_4_ = uVar2;
  auVar63._16_4_ = uVar2;
  auVar63._20_4_ = uVar2;
  auVar63._24_4_ = uVar2;
  auVar63._28_4_ = uVar2;
  auVar3 = vpmulld_avx2((undefined1  [32])local_780,auVar38);
  auVar4 = vpmulld_avx2((undefined1  [32])local_820,auVar63);
  local_3c0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_3c0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar63,(undefined1  [32])alVar8);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar6,auVar38);
  local_320 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_320,1,iVar30,1);
  alVar8 = local_7a0;
  alVar6 = local_800;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1b0);
  auVar39._4_4_ = uVar2;
  auVar39._0_4_ = uVar2;
  auVar39._8_4_ = uVar2;
  auVar39._12_4_ = uVar2;
  auVar39._16_4_ = uVar2;
  auVar39._20_4_ = uVar2;
  auVar39._24_4_ = uVar2;
  auVar39._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x210);
  auVar64._4_4_ = uVar2;
  auVar64._0_4_ = uVar2;
  auVar64._8_4_ = uVar2;
  auVar64._12_4_ = uVar2;
  auVar64._16_4_ = uVar2;
  auVar64._20_4_ = uVar2;
  auVar64._24_4_ = uVar2;
  auVar64._28_4_ = uVar2;
  auVar3 = vpmulld_avx2((undefined1  [32])local_7a0,auVar39);
  auVar4 = vpmulld_avx2((undefined1  [32])local_800,auVar64);
  local_3a0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_3a0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar64,(undefined1  [32])alVar8);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar6,auVar39);
  local_340 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_340,1,iVar30,1);
  alVar8 = local_7c0;
  alVar6 = local_7e0;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x230);
  auVar40._4_4_ = uVar2;
  auVar40._0_4_ = uVar2;
  auVar40._8_4_ = uVar2;
  auVar40._12_4_ = uVar2;
  auVar40._16_4_ = uVar2;
  auVar40._20_4_ = uVar2;
  auVar40._24_4_ = uVar2;
  auVar40._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 400);
  auVar65._4_4_ = uVar2;
  auVar65._0_4_ = uVar2;
  auVar65._8_4_ = uVar2;
  auVar65._12_4_ = uVar2;
  auVar65._16_4_ = uVar2;
  auVar65._20_4_ = uVar2;
  auVar65._24_4_ = uVar2;
  auVar65._28_4_ = uVar2;
  auVar3 = vpmulld_avx2((undefined1  [32])local_7c0,auVar40);
  auVar4 = vpmulld_avx2((undefined1  [32])local_7e0,auVar65);
  local_380 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_380,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar65,(undefined1  [32])alVar8);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar6,auVar40);
  local_360 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_360,1,iVar30,1);
  alVar14 = local_480;
  alVar13 = local_4a0;
  alVar8 = local_4c0;
  alVar6 = local_4e0;
  auVar3 = vpaddd_avx2((undefined1  [32])local_720,(undefined1  [32])local_740);
  auVar33 = vpsubd_avx2((undefined1  [32])local_740,(undefined1  [32])local_720);
  auVar39 = vpsubd_avx2((undefined1  [32])local_6e0,(undefined1  [32])local_700);
  auVar4 = vpaddd_avx2((undefined1  [32])local_700,(undefined1  [32])local_6e0);
  auVar31 = vpaddd_avx2((undefined1  [32])local_6a0,(undefined1  [32])local_6c0);
  auVar40 = vpsubd_avx2((undefined1  [32])local_6c0,(undefined1  [32])local_6a0);
  auVar48 = vpsubd_avx2((undefined1  [32])alVar9,(undefined1  [32])local_680);
  auVar32 = vpaddd_avx2((undefined1  [32])local_680,(undefined1  [32])alVar9);
  auVar5 = vpaddd_avx2((undefined1  [32])local_620,(undefined1  [32])alVar10);
  auVar50 = vpsubd_avx2((undefined1  [32])alVar10,(undefined1  [32])local_620);
  auVar47 = vpsubd_avx2((undefined1  [32])alVar11,(undefined1  [32])local_600);
  auVar34 = vpaddd_avx2((undefined1  [32])local_600,(undefined1  [32])alVar11);
  auVar35 = vpaddd_avx2((undefined1  [32])local_5a0,(undefined1  [32])alVar12);
  auVar44 = vpsubd_avx2((undefined1  [32])alVar12,(undefined1  [32])local_5a0);
  auVar43 = vpsubd_avx2((undefined1  [32])alVar7,(undefined1  [32])local_580);
  auVar36 = vpaddd_avx2((undefined1  [32])local_580,(undefined1  [32])alVar7);
  lVar18 = local_4e0[3];
  lVar20 = local_4c0[3];
  lVar22 = local_4a0[3];
  lVar24 = local_480[3];
  local_8c0[0] = local_460[0];
  local_8c0[1] = local_460[1];
  local_8c0[2] = local_460[2];
  local_8c0[3] = local_460[3];
  local_8a0[0] = local_440[0];
  local_8a0[1] = local_440[1];
  local_8a0[2] = local_440[2];
  local_8a0[3] = local_440[3];
  local_880[0] = local_420[0];
  local_880[1] = local_420[1];
  local_880[2] = local_420[2];
  local_880[3] = local_420[3];
  local_860[0] = local_400[0];
  local_860[1] = local_400[1];
  local_860[2] = local_400[2];
  local_860[3] = local_400[3];
  local_840[0] = local_3e0[0];
  local_840[1] = local_3e0[1];
  local_840[2] = local_3e0[2];
  local_840[3] = local_3e0[3];
  local_820[0] = local_3c0[0];
  local_820[1] = local_3c0[1];
  local_820[2] = local_3c0[2];
  local_820[3] = local_3c0[3];
  local_800[0] = local_3a0[0];
  local_800[1] = local_3a0[1];
  local_800[2] = local_3a0[2];
  local_800[3] = local_3a0[3];
  local_7e0[0] = local_380[0];
  local_7e0[1] = local_380[1];
  local_7e0[2] = local_380[2];
  local_7e0[3] = local_380[3];
  local_7c0[0] = local_360[0];
  local_7c0[1] = local_360[1];
  local_7c0[2] = local_360[2];
  local_7c0[3] = local_360[3];
  local_7a0[0] = local_340[0];
  local_7a0[1] = local_340[1];
  local_7a0[2] = local_340[2];
  local_7a0[3] = local_340[3];
  local_780[0] = local_320[0];
  local_780[1] = local_320[1];
  local_780[2] = local_320[2];
  local_780[3] = local_320[3];
  local_760[0] = local_300[0];
  local_760[1] = local_300[1];
  local_760[2] = local_300[2];
  local_760[3] = local_300[3];
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x168);
  auVar41._4_4_ = uVar2;
  auVar41._0_4_ = uVar2;
  auVar41._8_4_ = uVar2;
  auVar41._12_4_ = uVar2;
  auVar41._16_4_ = uVar2;
  auVar41._20_4_ = uVar2;
  auVar41._24_4_ = uVar2;
  auVar41._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 600);
  auVar66._4_4_ = uVar2;
  auVar66._0_4_ = uVar2;
  auVar66._8_4_ = uVar2;
  auVar66._12_4_ = uVar2;
  auVar66._16_4_ = uVar2;
  auVar66._20_4_ = uVar2;
  auVar66._24_4_ = uVar2;
  auVar66._28_4_ = uVar2;
  auVar37 = vpmulld_avx2(auVar41,auVar36);
  auVar38 = vpmulld_avx2(auVar66,auVar3);
  local_740 = (__m256i)vpaddd_avx2(auVar38,auVar37);
  round_shift_32_8xn_avx2(&local_740,1,iVar30,1);
  auVar36 = vpmulld_avx2(auVar66,auVar36);
  auVar3 = vpmulld_avx2(auVar41,auVar3);
  local_560 = (__m256i)vpsubd_avx2(auVar36,auVar3);
  round_shift_32_8xn_avx2(&local_560,1,iVar30,1);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1e8);
  auVar42._4_4_ = uVar2;
  auVar42._0_4_ = uVar2;
  auVar42._8_4_ = uVar2;
  auVar42._12_4_ = uVar2;
  auVar42._16_4_ = uVar2;
  auVar42._20_4_ = uVar2;
  auVar42._24_4_ = uVar2;
  auVar42._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1d8);
  auVar53._4_4_ = uVar2;
  auVar53._0_4_ = uVar2;
  auVar53._8_4_ = uVar2;
  auVar53._12_4_ = uVar2;
  auVar53._16_4_ = uVar2;
  auVar53._20_4_ = uVar2;
  auVar53._24_4_ = uVar2;
  auVar53._28_4_ = uVar2;
  auVar3 = vpmulld_avx2(auVar42,auVar43);
  auVar36 = vpmulld_avx2(auVar53,auVar33);
  local_720 = (__m256i)vpaddd_avx2(auVar36,auVar3);
  round_shift_32_8xn_avx2(&local_720,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar53,auVar43);
  auVar36 = vpmulld_avx2(auVar42,auVar33);
  local_580 = (__m256i)vpsubd_avx2(auVar3,auVar36);
  round_shift_32_8xn_avx2(&local_580,1,iVar30,1);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1a8);
  auVar43._4_4_ = uVar2;
  auVar43._0_4_ = uVar2;
  auVar43._8_4_ = uVar2;
  auVar43._12_4_ = uVar2;
  auVar43._16_4_ = uVar2;
  auVar43._20_4_ = uVar2;
  auVar43._24_4_ = uVar2;
  auVar43._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x218);
  auVar54._4_4_ = uVar2;
  auVar54._0_4_ = uVar2;
  auVar54._8_4_ = uVar2;
  auVar54._12_4_ = uVar2;
  auVar54._16_4_ = uVar2;
  auVar54._20_4_ = uVar2;
  auVar54._24_4_ = uVar2;
  auVar54._28_4_ = uVar2;
  auVar3 = vpmulld_avx2(auVar43,auVar44);
  auVar36 = vpmulld_avx2(auVar54,auVar39);
  local_700 = (__m256i)vpaddd_avx2(auVar36,auVar3);
  round_shift_32_8xn_avx2(&local_700,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar54,auVar44);
  auVar36 = vpmulld_avx2(auVar43,auVar39);
  local_5a0 = (__m256i)vpsubd_avx2(auVar3,auVar36);
  round_shift_32_8xn_avx2(&local_5a0,1,iVar30,1);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x228);
  auVar44._4_4_ = uVar2;
  auVar44._0_4_ = uVar2;
  auVar44._8_4_ = uVar2;
  auVar44._12_4_ = uVar2;
  auVar44._16_4_ = uVar2;
  auVar44._20_4_ = uVar2;
  auVar44._24_4_ = uVar2;
  auVar44._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x198);
  auVar55._4_4_ = uVar2;
  auVar55._0_4_ = uVar2;
  auVar55._8_4_ = uVar2;
  auVar55._12_4_ = uVar2;
  auVar55._16_4_ = uVar2;
  auVar55._20_4_ = uVar2;
  auVar55._24_4_ = uVar2;
  auVar55._28_4_ = uVar2;
  auVar3 = vpmulld_avx2(auVar44,auVar35);
  auVar36 = vpmulld_avx2(auVar55,auVar4);
  local_6e0 = (__m256i)vpaddd_avx2(auVar36,auVar3);
  round_shift_32_8xn_avx2(&local_6e0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar55,auVar35);
  auVar4 = vpmulld_avx2(auVar44,auVar4);
  local_5c0 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_5c0,1,iVar30,1);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x188);
  auVar45._4_4_ = uVar2;
  auVar45._0_4_ = uVar2;
  auVar45._8_4_ = uVar2;
  auVar45._12_4_ = uVar2;
  auVar45._16_4_ = uVar2;
  auVar45._20_4_ = uVar2;
  auVar45._24_4_ = uVar2;
  auVar45._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x238);
  auVar56._4_4_ = uVar2;
  auVar56._0_4_ = uVar2;
  auVar56._8_4_ = uVar2;
  auVar56._12_4_ = uVar2;
  auVar56._16_4_ = uVar2;
  auVar56._20_4_ = uVar2;
  auVar56._24_4_ = uVar2;
  auVar56._28_4_ = uVar2;
  auVar3 = vpmulld_avx2(auVar45,auVar34);
  auVar4 = vpmulld_avx2(auVar56,auVar31);
  local_6c0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_6c0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar56,auVar34);
  auVar4 = vpmulld_avx2(auVar45,auVar31);
  local_5e0 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_5e0,1,iVar30,1);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x208);
  auVar46._4_4_ = uVar2;
  auVar46._0_4_ = uVar2;
  auVar46._8_4_ = uVar2;
  auVar46._12_4_ = uVar2;
  auVar46._16_4_ = uVar2;
  auVar46._20_4_ = uVar2;
  auVar46._24_4_ = uVar2;
  auVar46._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1b8);
  auVar57._4_4_ = uVar2;
  auVar57._0_4_ = uVar2;
  auVar57._8_4_ = uVar2;
  auVar57._12_4_ = uVar2;
  auVar57._16_4_ = uVar2;
  auVar57._20_4_ = uVar2;
  auVar57._24_4_ = uVar2;
  auVar57._28_4_ = uVar2;
  auVar3 = vpmulld_avx2(auVar46,auVar47);
  auVar4 = vpmulld_avx2(auVar57,auVar40);
  local_6a0 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_6a0,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar57,auVar47);
  auVar4 = vpmulld_avx2(auVar46,auVar40);
  local_600 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_600,1,iVar30,1);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1c8);
  auVar47._4_4_ = uVar2;
  auVar47._0_4_ = uVar2;
  auVar47._8_4_ = uVar2;
  auVar47._12_4_ = uVar2;
  auVar47._16_4_ = uVar2;
  auVar47._20_4_ = uVar2;
  auVar47._24_4_ = uVar2;
  auVar47._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x1f8);
  auVar58._4_4_ = uVar2;
  auVar58._0_4_ = uVar2;
  auVar58._8_4_ = uVar2;
  auVar58._12_4_ = uVar2;
  auVar58._16_4_ = uVar2;
  auVar58._20_4_ = uVar2;
  auVar58._24_4_ = uVar2;
  auVar58._28_4_ = uVar2;
  auVar3 = vpmulld_avx2(auVar47,auVar50);
  auVar4 = vpmulld_avx2(auVar58,auVar48);
  local_680 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_680,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar58,auVar50);
  auVar4 = vpmulld_avx2(auVar47,auVar48);
  local_620 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_620,1,iVar30,1);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x248);
  auVar48._4_4_ = uVar2;
  auVar48._0_4_ = uVar2;
  auVar48._8_4_ = uVar2;
  auVar48._12_4_ = uVar2;
  auVar48._16_4_ = uVar2;
  auVar48._20_4_ = uVar2;
  auVar48._24_4_ = uVar2;
  auVar48._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar29 + 0x178);
  auVar59._4_4_ = uVar2;
  auVar59._0_4_ = uVar2;
  auVar59._8_4_ = uVar2;
  auVar59._12_4_ = uVar2;
  auVar59._16_4_ = uVar2;
  auVar59._20_4_ = uVar2;
  auVar59._24_4_ = uVar2;
  auVar59._28_4_ = uVar2;
  auVar3 = vpmulld_avx2(auVar48,auVar5);
  auVar4 = vpmulld_avx2(auVar59,auVar32);
  local_660 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  round_shift_32_8xn_avx2(&local_660,1,iVar30,1);
  auVar3 = vpmulld_avx2(auVar59,auVar5);
  auVar4 = vpmulld_avx2(auVar48,auVar32);
  local_640 = (__m256i)vpsubd_avx2(auVar3,auVar4);
  round_shift_32_8xn_avx2(&local_640,1,iVar30,1);
  local_940 = alVar6[0];
  lStack_938 = alVar6[1];
  lStack_930 = alVar6[2];
  (*output)[0] = local_940;
  (*output)[1] = lStack_938;
  (*output)[2] = lStack_930;
  (*output)[3] = lVar18;
  palVar1 = output + outstride * 0x1f;
  (*palVar1)[0] = local_560[0];
  (*palVar1)[1] = local_560[1];
  (*palVar1)[2] = local_560[2];
  (*palVar1)[3] = local_560[3];
  palVar1 = output + outstride;
  (*palVar1)[0] = local_740[0];
  (*palVar1)[1] = local_740[1];
  (*palVar1)[2] = local_740[2];
  (*palVar1)[3] = local_740[3];
  palVar1 = output + outstride * 0x1e;
  (*palVar1)[0] = local_760[0];
  (*palVar1)[1] = local_760[1];
  (*palVar1)[2] = local_760[2];
  (*palVar1)[3] = local_760[3];
  palVar1 = output + outstride * 2;
  (*palVar1)[0] = local_840[0];
  (*palVar1)[1] = local_840[1];
  (*palVar1)[2] = local_840[2];
  (*palVar1)[3] = local_840[3];
  palVar1 = output + outstride * 0x1d;
  (*palVar1)[0] = local_660[0];
  (*palVar1)[1] = local_660[1];
  (*palVar1)[2] = local_660[2];
  (*palVar1)[3] = local_660[3];
  palVar1 = output + outstride * 3;
  (*palVar1)[0] = local_640[0];
  (*palVar1)[1] = local_640[1];
  (*palVar1)[2] = local_640[2];
  (*palVar1)[3] = local_640[3];
  palVar1 = output + outstride * 0x1c;
  (*palVar1)[0] = local_860[0];
  (*palVar1)[1] = local_860[1];
  (*palVar1)[2] = local_860[2];
  (*palVar1)[3] = local_860[3];
  palVar1 = output + outstride * 4;
  (*palVar1)[0] = local_8c0[0];
  (*palVar1)[1] = local_8c0[1];
  (*palVar1)[2] = local_8c0[2];
  (*palVar1)[3] = local_8c0[3];
  palVar1 = output + outstride * 0x1b;
  (*palVar1)[0] = local_5e0[0];
  (*palVar1)[1] = local_5e0[1];
  (*palVar1)[2] = local_5e0[2];
  (*palVar1)[3] = local_5e0[3];
  palVar1 = output + outstride * 5;
  (*palVar1)[0] = local_6c0[0];
  (*palVar1)[1] = local_6c0[1];
  (*palVar1)[2] = local_6c0[2];
  (*palVar1)[3] = local_6c0[3];
  palVar1 = output + outstride * 0x1a;
  (*palVar1)[0] = local_7e0[0];
  (*palVar1)[1] = local_7e0[1];
  (*palVar1)[2] = local_7e0[2];
  (*palVar1)[3] = local_7e0[3];
  palVar1 = output + outstride * 6;
  (*palVar1)[0] = local_7c0[0];
  (*palVar1)[1] = local_7c0[1];
  (*palVar1)[2] = local_7c0[2];
  (*palVar1)[3] = local_7c0[3];
  palVar1 = output + outstride * 0x19;
  (*palVar1)[0] = local_6e0[0];
  (*palVar1)[1] = local_6e0[1];
  (*palVar1)[2] = local_6e0[2];
  (*palVar1)[3] = local_6e0[3];
  palVar1 = output + outstride * 7;
  (*palVar1)[0] = local_5c0[0];
  (*palVar1)[1] = local_5c0[1];
  (*palVar1)[2] = local_5c0[2];
  (*palVar1)[3] = local_5c0[3];
  local_8e0 = alVar14[0];
  lStack_8d8 = alVar14[1];
  lStack_8d0 = alVar14[2];
  palVar1 = output + outstride * 0x18;
  (*palVar1)[0] = local_8e0;
  (*palVar1)[1] = lStack_8d8;
  (*palVar1)[2] = lStack_8d0;
  (*palVar1)[3] = lVar24;
  local_900 = alVar13[0];
  lStack_8f8 = alVar13[1];
  lStack_8f0 = alVar13[2];
  palVar1 = output + outstride * 8;
  (*palVar1)[0] = local_900;
  (*palVar1)[1] = lStack_8f8;
  (*palVar1)[2] = lStack_8f0;
  (*palVar1)[3] = lVar22;
  palVar1 = output + outstride * 0x17;
  (*palVar1)[0] = local_5a0[0];
  (*palVar1)[1] = local_5a0[1];
  (*palVar1)[2] = local_5a0[2];
  (*palVar1)[3] = local_5a0[3];
  palVar1 = output + outstride * 9;
  (*palVar1)[0] = local_700[0];
  (*palVar1)[1] = local_700[1];
  (*palVar1)[2] = local_700[2];
  (*palVar1)[3] = local_700[3];
  palVar1 = output + outstride * 0x16;
  (*palVar1)[0] = local_7a0[0];
  (*palVar1)[1] = local_7a0[1];
  (*palVar1)[2] = local_7a0[2];
  (*palVar1)[3] = local_7a0[3];
  palVar1 = output + outstride * 10;
  (*palVar1)[0] = local_800[0];
  (*palVar1)[1] = local_800[1];
  (*palVar1)[2] = local_800[2];
  (*palVar1)[3] = local_800[3];
  palVar1 = output + outstride * 0x15;
  (*palVar1)[0] = local_6a0[0];
  (*palVar1)[1] = local_6a0[1];
  (*palVar1)[2] = local_6a0[2];
  (*palVar1)[3] = local_6a0[3];
  palVar1 = output + outstride * 0xb;
  (*palVar1)[0] = local_600[0];
  (*palVar1)[1] = local_600[1];
  (*palVar1)[2] = local_600[2];
  (*palVar1)[3] = local_600[3];
  palVar1 = output + outstride * 0x14;
  (*palVar1)[0] = local_8a0[0];
  (*palVar1)[1] = local_8a0[1];
  (*palVar1)[2] = local_8a0[2];
  (*palVar1)[3] = local_8a0[3];
  palVar1 = output + outstride * 0xc;
  (*palVar1)[0] = local_880[0];
  (*palVar1)[1] = local_880[1];
  (*palVar1)[2] = local_880[2];
  (*palVar1)[3] = local_880[3];
  palVar1 = output + outstride * 0x13;
  (*palVar1)[0] = local_620[0];
  (*palVar1)[1] = local_620[1];
  (*palVar1)[2] = local_620[2];
  (*palVar1)[3] = local_620[3];
  palVar1 = output + outstride * 0xd;
  (*palVar1)[0] = local_680[0];
  (*palVar1)[1] = local_680[1];
  (*palVar1)[2] = local_680[2];
  (*palVar1)[3] = local_680[3];
  palVar1 = output + outstride * 0x12;
  (*palVar1)[0] = local_820[0];
  (*palVar1)[1] = local_820[1];
  (*palVar1)[2] = local_820[2];
  (*palVar1)[3] = local_820[3];
  palVar1 = output + outstride * 0xe;
  (*palVar1)[0] = local_780[0];
  (*palVar1)[1] = local_780[1];
  (*palVar1)[2] = local_780[2];
  (*palVar1)[3] = local_780[3];
  palVar1 = output + outstride * 0x11;
  (*palVar1)[0] = local_720[0];
  (*palVar1)[1] = local_720[1];
  (*palVar1)[2] = local_720[2];
  (*palVar1)[3] = local_720[3];
  palVar1 = output + outstride * 0xf;
  (*palVar1)[0] = local_580[0];
  (*palVar1)[1] = local_580[1];
  (*palVar1)[2] = local_580[2];
  (*palVar1)[3] = local_580[3];
  local_920 = alVar8[0];
  lStack_918 = alVar8[1];
  lStack_910 = alVar8[2];
  palVar1 = output + (outstride << 4);
  (*palVar1)[0] = local_920;
  (*palVar1)[1] = lStack_918;
  (*palVar1)[2] = lStack_910;
  (*palVar1)[3] = lVar20;
  return;
}

Assistant:

static inline void fdct32_avx2(const __m256i *input, __m256i *output,
                               int8_t cos_bit) {
  __m256i x1[32];
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));
  // stage 0
  // stage 1
  btf_32_add_sub_out_avx2(&x1[0], &x1[31], input[0], input[31]);
  btf_32_add_sub_out_avx2(&x1[1], &x1[30], input[1], input[30]);
  btf_32_add_sub_out_avx2(&x1[2], &x1[29], input[2], input[29]);
  btf_32_add_sub_out_avx2(&x1[3], &x1[28], input[3], input[28]);
  btf_32_add_sub_out_avx2(&x1[4], &x1[27], input[4], input[27]);
  btf_32_add_sub_out_avx2(&x1[5], &x1[26], input[5], input[26]);
  btf_32_add_sub_out_avx2(&x1[6], &x1[25], input[6], input[25]);
  btf_32_add_sub_out_avx2(&x1[7], &x1[24], input[7], input[24]);
  btf_32_add_sub_out_avx2(&x1[8], &x1[23], input[8], input[23]);
  btf_32_add_sub_out_avx2(&x1[9], &x1[22], input[9], input[22]);
  btf_32_add_sub_out_avx2(&x1[10], &x1[21], input[10], input[21]);
  btf_32_add_sub_out_avx2(&x1[11], &x1[20], input[11], input[20]);
  btf_32_add_sub_out_avx2(&x1[12], &x1[19], input[12], input[19]);
  btf_32_add_sub_out_avx2(&x1[13], &x1[18], input[13], input[18]);
  btf_32_add_sub_out_avx2(&x1[14], &x1[17], input[14], input[17]);
  btf_32_add_sub_out_avx2(&x1[15], &x1[16], input[15], input[16]);

  // stage 2
  btf_32_add_sub_avx2(&x1[0], &x1[15]);
  btf_32_add_sub_avx2(&x1[1], &x1[14]);
  btf_32_add_sub_avx2(&x1[2], &x1[13]);
  btf_32_add_sub_avx2(&x1[3], &x1[12]);
  btf_32_add_sub_avx2(&x1[4], &x1[11]);
  btf_32_add_sub_avx2(&x1[5], &x1[10]);
  btf_32_add_sub_avx2(&x1[6], &x1[9]);
  btf_32_add_sub_avx2(&x1[7], &x1[8]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[22], &x1[25], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[23], &x1[24], _r, cos_bit);

  // stage 3
  btf_32_add_sub_avx2(&x1[0], &x1[7]);
  btf_32_add_sub_avx2(&x1[1], &x1[6]);
  btf_32_add_sub_avx2(&x1[2], &x1[5]);
  btf_32_add_sub_avx2(&x1[3], &x1[4]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[10], &x1[13], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[11], &x1[12], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[23]);
  btf_32_add_sub_avx2(&x1[17], &x1[22]);
  btf_32_add_sub_avx2(&x1[18], &x1[21]);
  btf_32_add_sub_avx2(&x1[19], &x1[20]);
  btf_32_add_sub_avx2(&x1[31], &x1[24]);
  btf_32_add_sub_avx2(&x1[30], &x1[25]);
  btf_32_add_sub_avx2(&x1[29], &x1[26]);
  btf_32_add_sub_avx2(&x1[28], &x1[27]);

  // stage 4
  btf_32_add_sub_avx2(&x1[0], &x1[3]);
  btf_32_add_sub_avx2(&x1[1], &x1[2]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[5], &x1[6], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[8], &x1[11]);
  btf_32_add_sub_avx2(&x1[9], &x1[10]);
  btf_32_add_sub_avx2(&x1[15], &x1[12]);
  btf_32_add_sub_avx2(&x1[14], &x1[13]);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[19], &x1[28], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[21], &x1[26], _r, cos_bit);

  // stage 5
  btf_32_avx2_type0(cospi[32], cospi[32], &x1[0], &x1[1], _r, cos_bit);
  btf_32_avx2_type1(cospi[48], cospi[16], &x1[2], &x1[3], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[4], &x1[5]);
  btf_32_add_sub_avx2(&x1[7], &x1[6]);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[9], &x1[14], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[10], &x1[13], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[19]);
  btf_32_add_sub_avx2(&x1[17], &x1[18]);
  btf_32_add_sub_avx2(&x1[23], &x1[20]);
  btf_32_add_sub_avx2(&x1[22], &x1[21]);
  btf_32_add_sub_avx2(&x1[24], &x1[27]);
  btf_32_add_sub_avx2(&x1[25], &x1[26]);
  btf_32_add_sub_avx2(&x1[31], &x1[28]);
  btf_32_add_sub_avx2(&x1[30], &x1[29]);

  // stage 6
  btf_32_avx2_type1(cospi[56], cospi[8], &x1[4], &x1[7], _r, cos_bit);
  btf_32_avx2_type1(cospi[24], cospi[40], &x1[5], &x1[6], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[8], &x1[9]);
  btf_32_add_sub_avx2(&x1[11], &x1[10]);
  btf_32_add_sub_avx2(&x1[12], &x1[13]);
  btf_32_add_sub_avx2(&x1[15], &x1[14]);
  btf_32_avx2_type0(-cospi[8], cospi[56], &x1[17], &x1[30], _r, cos_bit);
  btf_32_avx2_type0(-cospi[56], -cospi[8], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type0(-cospi[40], cospi[24], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type0(-cospi[24], -cospi[40], &x1[22], &x1[25], _r, cos_bit);

  // stage 7
  btf_32_avx2_type1(cospi[60], cospi[4], &x1[8], &x1[15], _r, cos_bit);
  btf_32_avx2_type1(cospi[28], cospi[36], &x1[9], &x1[14], _r, cos_bit);
  btf_32_avx2_type1(cospi[44], cospi[20], &x1[10], &x1[13], _r, cos_bit);
  btf_32_avx2_type1(cospi[12], cospi[52], &x1[11], &x1[12], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[17]);
  btf_32_add_sub_avx2(&x1[19], &x1[18]);
  btf_32_add_sub_avx2(&x1[20], &x1[21]);
  btf_32_add_sub_avx2(&x1[23], &x1[22]);
  btf_32_add_sub_avx2(&x1[24], &x1[25]);
  btf_32_add_sub_avx2(&x1[27], &x1[26]);
  btf_32_add_sub_avx2(&x1[28], &x1[29]);
  btf_32_add_sub_avx2(&x1[31], &x1[30]);

  // stage 8
  btf_32_avx2_type1(cospi[62], cospi[2], &x1[16], &x1[31], _r, cos_bit);
  btf_32_avx2_type1(cospi[30], cospi[34], &x1[17], &x1[30], _r, cos_bit);
  btf_32_avx2_type1(cospi[46], cospi[18], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type1(cospi[14], cospi[50], &x1[19], &x1[28], _r, cos_bit);
  btf_32_avx2_type1(cospi[54], cospi[10], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type1(cospi[22], cospi[42], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type1(cospi[38], cospi[26], &x1[22], &x1[25], _r, cos_bit);
  btf_32_avx2_type1(cospi[6], cospi[58], &x1[23], &x1[24], _r, cos_bit);

  // stage 9
  output[0] = x1[0];
  output[1] = x1[16];
  output[2] = x1[8];
  output[3] = x1[24];
  output[4] = x1[4];
  output[5] = x1[20];
  output[6] = x1[12];
  output[7] = x1[28];
  output[8] = x1[2];
  output[9] = x1[18];
  output[10] = x1[10];
  output[11] = x1[26];
  output[12] = x1[6];
  output[13] = x1[22];
  output[14] = x1[14];
  output[15] = x1[30];
  output[16] = x1[1];
  output[17] = x1[17];
  output[18] = x1[9];
  output[19] = x1[25];
  output[20] = x1[5];
  output[21] = x1[21];
  output[22] = x1[13];
  output[23] = x1[29];
  output[24] = x1[3];
  output[25] = x1[19];
  output[26] = x1[11];
  output[27] = x1[27];
  output[28] = x1[7];
  output[29] = x1[23];
  output[30] = x1[15];
  output[31] = x1[31];
}